

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O2

Score __thiscall
INetwork::ScoreModel(INetwork *this,Dataset *data,LossFunction lossFunction,bool onTest,Time time)

{
  long lVar1;
  long lVar2;
  undefined3 in_register_00000009;
  long lVar3;
  int sampleId;
  ulong uVar4;
  Score SVar5;
  allocator_type local_59;
  vector<float,_std::allocator<float>_> *local_58;
  LossFunction local_50;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  predictions;
  
  local_58 = &data->yTrain;
  lVar3 = 0;
  lVar2 = lVar3;
  if (CONCAT31(in_register_00000009,onTest) != 0) {
    local_58 = &data->yTest;
    lVar2 = 0x30;
  }
  local_50 = lossFunction;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&predictions,
           (*(long *)((long)&(data->xTrain).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar2) -
           *(long *)((long)&(data->xTrain).
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar2)) / 0x18,&local_59);
  for (uVar4 = 0;
      lVar1 = *(long *)((long)&(data->xTrain).
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar2),
      uVar4 < (ulong)((*(long *)((long)&(data->xTrain).
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar2) - lVar1)
                     / 0x18); uVar4 = uVar4 + 1) {
    (*this->_vptr_INetwork[4])
              (time,this,lVar1 + lVar3,
               (long)&((predictions.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar3);
    lVar3 = lVar3 + 0x18;
  }
  SVar5 = (*local_50)(&predictions,local_58);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&predictions);
  return SVar5;
}

Assistant:

SPIKING_NN::Score INetwork::ScoreModel( SPIKING_NN::Dataset &data, SPIKING_NN::LossFunction lossFunction, bool onTest,
                                        SPIKING_NN::Time time )
{
    std::vector<SPIKING_NN::Sample> &samples = ( onTest ? data.xTest : data.xTrain );
    std::vector<SPIKING_NN::Target> &labels = ( onTest ? data.yTest : data.yTrain );
    std::vector<SPIKING_NN::Output> predictions( samples.size());
    for ( int sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        Forward( samples[sampleId], predictions[sampleId], time );
    }
    return lossFunction( predictions, labels );
}